

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O0

int sinc_multichan_vari_process(SRC_PRIVATE *psrc,SRC_DATA *data)

{
  double dVar1;
  int iVar2;
  int iVar3;
  increment_t iVar4;
  increment_t iVar5;
  SINC_FILTER *filter_00;
  long lVar6;
  long in_RSI;
  double *in_RDI;
  double dVar7;
  SINC_FILTER *filter_01;
  double dVar8;
  int samples_in_hand;
  int half_filter_chan_len;
  increment_t start_filter_index;
  increment_t increment;
  double rem;
  double terminate;
  double float_increment;
  double count;
  double src_ratio;
  double input_index;
  SINC_FILTER *filter;
  double in_stack_ffffffffffffff68;
  SRC_DATA *in_stack_ffffffffffffff70;
  double local_70;
  double local_68;
  int iVar9;
  double local_38;
  double local_30;
  double local_28;
  int local_4;
  
  if (in_RDI[4] == 0.0) {
    local_4 = 5;
  }
  else {
    dVar1 = in_RDI[4];
    *(long *)((long)dVar1 + 8) = *(long *)(in_RSI + 0x10) * (long)*(int *)((long)dVar1 + 4);
    *(long *)((long)dVar1 + 0x18) = *(long *)(in_RSI + 0x18) * (long)*(int *)((long)dVar1 + 4);
    *(undefined8 *)((long)dVar1 + 0x20) = 0;
    *(undefined8 *)((long)dVar1 + 0x10) = 0;
    local_30 = *in_RDI;
    iVar2 = is_bad_src_ratio(local_30);
    if (iVar2 == 0) {
      local_38 = ((double)*(int *)((long)dVar1 + 0x28) + 2.0) / (double)*(int *)((long)dVar1 + 0x2c)
      ;
      if (*(double *)(in_RSI + 0x38) <= *in_RDI) {
        local_68 = *(double *)(in_RSI + 0x38);
      }
      else {
        local_68 = *in_RDI;
      }
      if (local_68 < 1.0) {
        if (*(double *)(in_RSI + 0x38) <= *in_RDI) {
          local_70 = *(double *)(in_RSI + 0x38);
        }
        else {
          local_70 = *in_RDI;
        }
        local_38 = local_38 / local_70;
      }
      filter_00 = (SINC_FILTER *)(long)*(int *)((long)dVar1 + 4);
      lVar6 = lrint(local_38);
      iVar3 = (int)filter_00 * ((int)lVar6 + 1);
      dVar7 = in_RDI[1];
      local_28 = fmod_one(in_stack_ffffffffffffff68);
      iVar2 = *(int *)((long)dVar1 + 0x48);
      iVar9 = *(int *)((long)dVar1 + 4);
      lVar6 = lrint(dVar7 - local_28);
      *(int *)((long)dVar1 + 0x48) =
           (int)(((long)iVar2 + iVar9 * lVar6) % (long)*(int *)((long)dVar1 + 0x54));
      dVar7 = 1.0 / local_30 + 1e-20;
      while (*(long *)((long)dVar1 + 0x20) < *(long *)((long)dVar1 + 0x18)) {
        iVar2 = ((*(int *)((long)dVar1 + 0x4c) - *(int *)((long)dVar1 + 0x48)) +
                *(int *)((long)dVar1 + 0x54)) % *(int *)((long)dVar1 + 0x54);
        dVar8 = local_28;
        if (iVar2 <= iVar3) {
          iVar2 = prepare_data(filter_00,in_stack_ffffffffffffff70,
                               (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
          *(int *)(in_RDI + 2) = iVar2;
          if (iVar2 != 0) {
            return *(int *)(in_RDI + 2);
          }
          iVar2 = ((*(int *)((long)dVar1 + 0x4c) - *(int *)((long)dVar1 + 0x48)) +
                  *(int *)((long)dVar1 + 0x54)) % *(int *)((long)dVar1 + 0x54);
          if (iVar2 <= iVar3) break;
        }
        iVar9 = (int)((ulong)dVar8 >> 0x20);
        if ((-1 < *(int *)((long)dVar1 + 0x50)) &&
           ((double)*(int *)((long)dVar1 + 0x50) <=
            (double)*(int *)((long)dVar1 + 0x48) + local_28 + dVar7)) break;
        if ((0 < *(long *)((long)dVar1 + 0x18)) &&
           (1e-10 < ABS(*in_RDI - *(double *)(in_RSI + 0x38)))) {
          local_30 = *in_RDI + ((double)*(long *)((long)dVar1 + 0x20) *
                               (*(double *)(in_RSI + 0x38) - *in_RDI)) /
                               (double)*(long *)((long)dVar1 + 0x18);
        }
        in_stack_ffffffffffffff70 = (SRC_DATA *)(double)*(int *)((long)dVar1 + 0x2c);
        in_stack_ffffffffffffff68 = local_30;
        if (1.0 <= local_30) {
          in_stack_ffffffffffffff68 = 1.0;
        }
        filter_01 = (SINC_FILTER *)((double)in_stack_ffffffffffffff70 * in_stack_ffffffffffffff68);
        iVar4 = double_to_fp(5.39110104838239e-318);
        iVar5 = double_to_fp(5.39121962413739e-318);
        calc_output_multi(filter_01,(increment_t)((ulong)dVar7 >> 0x20),SUB84(dVar7,0),iVar9,
                          (double)CONCAT44(iVar4,iVar5),(float *)CONCAT44(iVar3,iVar2));
        *(long *)((long)dVar1 + 0x20) =
             (long)*(int *)((long)in_RDI + 0x14) + *(long *)((long)dVar1 + 0x20);
        dVar8 = 1.0 / local_30 + local_28;
        local_28 = fmod_one(in_stack_ffffffffffffff68);
        iVar2 = *(int *)((long)dVar1 + 0x48);
        iVar9 = *(int *)((long)dVar1 + 4);
        lVar6 = lrint(dVar8 - local_28);
        *(int *)((long)dVar1 + 0x48) =
             (int)(((long)iVar2 + iVar9 * lVar6) % (long)*(int *)((long)dVar1 + 0x54));
      }
      in_RDI[1] = local_28;
      *in_RDI = local_30;
      *(long *)(in_RSI + 0x20) = *(long *)((long)dVar1 + 0x10) / (long)*(int *)((long)dVar1 + 4);
      *(long *)(in_RSI + 0x28) = *(long *)((long)dVar1 + 0x20) / (long)*(int *)((long)dVar1 + 4);
      local_4 = 0;
    }
    else {
      local_4 = 0x16;
    }
  }
  return local_4;
}

Assistant:

static int
sinc_multichan_vari_process (SRC_PRIVATE *psrc, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (psrc->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) psrc->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * filter->channels ;
	filter->out_count = data->output_frames * filter->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = psrc->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (psrc->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (psrc->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = filter->channels * (lrint (count) + 1) ;

	input_index = psrc->last_position ;
	float_increment = filter->index_inc ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + filter->channels * lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((psrc->error = prepare_data (filter, data, half_filter_chan_len)) != 0)
				return psrc->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate >= filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = psrc->last_ratio + filter->out_gen * (data->src_ratio - psrc->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		calc_output_multi (filter, increment, start_filter_index, filter->channels, float_increment / filter->index_inc, data->data_out + filter->out_gen) ;
		filter->out_gen += psrc->channels ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + filter->channels * lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	psrc->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	psrc->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / filter->channels ;
	data->output_frames_gen = filter->out_gen / filter->channels ;

	return SRC_ERR_NO_ERROR ;
}